

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O2

double SSIMGet_SSE2(uint8_t *src1,int stride1,uint8_t *src2,int stride2)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  unkuint9 Var102;
  undefined1 auVar103 [11];
  undefined1 auVar104 [15];
  unkuint9 Var105;
  undefined1 auVar106 [11];
  undefined1 auVar107 [15];
  undefined1 auVar108 [11];
  undefined1 auVar109 [15];
  undefined1 auVar110 [11];
  undefined1 auVar111 [15];
  undefined1 auVar112 [11];
  undefined1 auVar113 [15];
  undefined1 auVar114 [11];
  undefined1 auVar115 [15];
  undefined1 auVar116 [11];
  undefined1 auVar117 [15];
  undefined1 auVar118 [11];
  undefined1 auVar119 [15];
  undefined1 auVar120 [11];
  undefined1 auVar121 [15];
  undefined1 auVar122 [11];
  undefined1 auVar123 [15];
  undefined1 auVar124 [11];
  undefined1 auVar125 [15];
  undefined1 auVar126 [11];
  undefined1 auVar127 [15];
  undefined1 auVar128 [11];
  undefined1 auVar129 [15];
  undefined1 auVar130 [11];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  long lVar159;
  long lVar160;
  short sVar162;
  short sVar163;
  short sVar164;
  double dVar161;
  short sVar165;
  short sVar166;
  short sVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  undefined2 uStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  undefined2 uStack_2a;
  VP8DistoStats local_28;
  ushort uVar171;
  ushort uVar180;
  
  uVar1 = *(ulong *)src1;
  uVar2 = *(ulong *)src2;
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar17._8_4_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[0xc] = (char)(uVar1 >> 0x30);
  auVar17._13_2_ = auVar3._13_2_;
  auVar31._8_4_ = 0;
  auVar31._0_8_ = uVar1;
  auVar31._12_3_ = auVar17._12_3_;
  auVar45._8_2_ = 0;
  auVar45._0_8_ = uVar1;
  auVar45[10] = (char)(uVar1 >> 0x28);
  auVar45._11_4_ = auVar31._11_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar1;
  auVar59._10_5_ = auVar45._10_5_;
  auVar73[8] = (char)(uVar1 >> 0x20);
  auVar73._0_8_ = uVar1;
  auVar73._9_6_ = auVar59._9_6_;
  auVar101._7_8_ = 0;
  auVar101._0_7_ = auVar73._8_7_;
  Var102 = CONCAT81(SUB158(auVar101 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar131._9_6_ = 0;
  auVar131._0_9_ = Var102;
  auVar103._1_10_ = SUB1510(auVar131 << 0x30,5);
  auVar103[0] = (char)(uVar1 >> 0x10);
  auVar132._11_4_ = 0;
  auVar132._0_11_ = auVar103;
  uVar180 = (ushort)uVar1;
  auVar87[2] = (char)(uVar1 >> 8);
  auVar87._0_2_ = uVar180;
  auVar87._3_12_ = SUB1512(auVar132 << 0x20,3);
  auVar181._0_2_ = uVar180 & 0xff;
  auVar181._2_13_ = auVar87._2_13_;
  auVar181[0xf] = 0;
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4[0xe] = (char)(uVar2 >> 0x38);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar2;
  auVar18[0xc] = (char)(uVar2 >> 0x30);
  auVar18._13_2_ = auVar4._13_2_;
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar2;
  auVar32._12_3_ = auVar18._12_3_;
  auVar46._8_2_ = 0;
  auVar46._0_8_ = uVar2;
  auVar46[10] = (char)(uVar2 >> 0x28);
  auVar46._11_4_ = auVar32._11_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar2;
  auVar60._10_5_ = auVar46._10_5_;
  auVar74[8] = (char)(uVar2 >> 0x20);
  auVar74._0_8_ = uVar2;
  auVar74._9_6_ = auVar60._9_6_;
  auVar104._7_8_ = 0;
  auVar104._0_7_ = auVar74._8_7_;
  Var105 = CONCAT81(SUB158(auVar104 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar133._9_6_ = 0;
  auVar133._0_9_ = Var105;
  auVar106._1_10_ = SUB1510(auVar133 << 0x30,5);
  auVar106[0] = (char)(uVar2 >> 0x10);
  auVar134._11_4_ = 0;
  auVar134._0_11_ = auVar106;
  uVar171 = (ushort)uVar2;
  auVar88[2] = (char)(uVar2 >> 8);
  auVar88._0_2_ = uVar171;
  auVar88._3_12_ = SUB1512(auVar134 << 0x20,3);
  auVar172._0_2_ = uVar171 & 0xff;
  auVar172._2_13_ = auVar88._2_13_;
  auVar172[0xf] = 0;
  sVar165 = auVar87._2_2_ * 2;
  sVar166 = auVar103._0_2_ * 3;
  sVar167 = (short)Var102 * 4;
  auVar186._0_8_ =
       CONCAT26(sVar167,CONCAT24(sVar166,CONCAT22(sVar165,uVar180))) & 0xffffffffffff00ff;
  auVar186._8_2_ = auVar73._8_2_ * 3;
  auVar186._10_2_ = auVar45._10_2_ * 2;
  auVar186._12_2_ = auVar17._12_2_;
  auVar186._14_2_ = 0;
  sVar162 = auVar88._2_2_ * 2;
  sVar163 = auVar106._0_2_ * 3;
  sVar164 = (short)Var105 * 4;
  auVar168._0_8_ =
       CONCAT26(sVar164,CONCAT24(sVar163,CONCAT22(sVar162,uVar171))) & 0xffffffffffff00ff;
  auVar168._8_2_ = auVar74._8_2_ * 3;
  auVar168._10_2_ = auVar46._10_2_ * 2;
  auVar168._12_2_ = auVar18._12_2_;
  auVar168._14_2_ = 0;
  auVar193 = pmaddwd(auVar181,auVar186);
  auVar182 = pmaddwd(auVar181,auVar168);
  auVar173 = pmaddwd(auVar172,auVar168);
  lVar159 = (long)stride1;
  lVar160 = (long)stride2;
  uVar1 = *(ulong *)(src1 + lVar159);
  uVar2 = *(ulong *)(src2 + lVar160);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19[0xc] = (char)(uVar1 >> 0x30);
  auVar19._13_2_ = auVar5._13_2_;
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar1;
  auVar33._12_3_ = auVar19._12_3_;
  auVar47._8_2_ = 0;
  auVar47._0_8_ = uVar1;
  auVar47[10] = (char)(uVar1 >> 0x28);
  auVar47._11_4_ = auVar33._11_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar1;
  auVar61._10_5_ = auVar47._10_5_;
  auVar75[8] = (char)(uVar1 >> 0x20);
  auVar75._0_8_ = uVar1;
  auVar75._9_6_ = auVar61._9_6_;
  auVar107._7_8_ = 0;
  auVar107._0_7_ = auVar75._8_7_;
  Var102 = CONCAT81(SUB158(auVar107 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar135._9_6_ = 0;
  auVar135._0_9_ = Var102;
  auVar108._1_10_ = SUB1510(auVar135 << 0x30,5);
  auVar108[0] = (char)(uVar1 >> 0x10);
  auVar136._11_4_ = 0;
  auVar136._0_11_ = auVar108;
  auVar89[2] = (char)(uVar1 >> 8);
  auVar89._0_2_ = (ushort)uVar1;
  auVar89._3_12_ = SUB1512(auVar136 << 0x20,3);
  auVar170._0_2_ = (ushort)uVar1 & 0xff;
  auVar170._2_13_ = auVar89._2_13_;
  auVar170[0xf] = 0;
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6[0xe] = (char)(uVar2 >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = uVar2;
  auVar20[0xc] = (char)(uVar2 >> 0x30);
  auVar20._13_2_ = auVar6._13_2_;
  auVar34._8_4_ = 0;
  auVar34._0_8_ = uVar2;
  auVar34._12_3_ = auVar20._12_3_;
  auVar48._8_2_ = 0;
  auVar48._0_8_ = uVar2;
  auVar48[10] = (char)(uVar2 >> 0x28);
  auVar48._11_4_ = auVar34._11_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar2;
  auVar62._10_5_ = auVar48._10_5_;
  auVar76[8] = (char)(uVar2 >> 0x20);
  auVar76._0_8_ = uVar2;
  auVar76._9_6_ = auVar62._9_6_;
  auVar109._7_8_ = 0;
  auVar109._0_7_ = auVar76._8_7_;
  Var105 = CONCAT81(SUB158(auVar109 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar137._9_6_ = 0;
  auVar137._0_9_ = Var105;
  auVar110._1_10_ = SUB1510(auVar137 << 0x30,5);
  auVar110[0] = (char)(uVar2 >> 0x10);
  auVar138._11_4_ = 0;
  auVar138._0_11_ = auVar110;
  auVar90[2] = (char)(uVar2 >> 8);
  auVar90._0_2_ = (ushort)uVar2;
  auVar90._3_12_ = SUB1512(auVar138 << 0x20,3);
  auVar183._0_2_ = (ushort)uVar2 & 0xff;
  auVar183._2_13_ = auVar90._2_13_;
  auVar183[0xf] = 0;
  auVar198._0_2_ = auVar170._0_2_ * 2;
  auVar198._2_2_ = auVar89._2_2_ * 4;
  auVar198._4_2_ = auVar108._0_2_ * 6;
  auVar198._6_2_ = (short)Var102 * 8;
  auVar198._8_2_ = auVar75._8_2_ * 6;
  auVar198._10_2_ = auVar47._10_2_ * 4;
  auVar198._12_2_ = auVar19._12_2_ * 2;
  auVar198._14_2_ = 0;
  auVar187._0_2_ = auVar183._0_2_ * 2;
  auVar187._2_2_ = auVar90._2_2_ * 4;
  auVar187._4_2_ = auVar110._0_2_ * 6;
  auVar187._6_2_ = (short)Var105 * 8;
  auVar187._8_2_ = auVar76._8_2_ * 6;
  auVar187._10_2_ = auVar48._10_2_ * 4;
  auVar187._12_2_ = auVar20._12_2_ * 2;
  auVar187._14_2_ = 0;
  auVar199 = pmaddwd(auVar198,auVar170);
  auVar177 = pmaddwd(auVar170,auVar187);
  auVar188 = pmaddwd(auVar187,auVar183);
  uVar1 = *(ulong *)(src1 + lVar159 * 2);
  uVar2 = *(ulong *)(src2 + lVar160 * 2);
  auVar7._8_6_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xe] = (char)(uVar1 >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21[0xc] = (char)(uVar1 >> 0x30);
  auVar21._13_2_ = auVar7._13_2_;
  auVar35._8_4_ = 0;
  auVar35._0_8_ = uVar1;
  auVar35._12_3_ = auVar21._12_3_;
  auVar49._8_2_ = 0;
  auVar49._0_8_ = uVar1;
  auVar49[10] = (char)(uVar1 >> 0x28);
  auVar49._11_4_ = auVar35._11_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar1;
  auVar63._10_5_ = auVar49._10_5_;
  auVar77[8] = (char)(uVar1 >> 0x20);
  auVar77._0_8_ = uVar1;
  auVar77._9_6_ = auVar63._9_6_;
  auVar111._7_8_ = 0;
  auVar111._0_7_ = auVar77._8_7_;
  Var102 = CONCAT81(SUB158(auVar111 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar139._9_6_ = 0;
  auVar139._0_9_ = Var102;
  auVar112._1_10_ = SUB1510(auVar139 << 0x30,5);
  auVar112[0] = (char)(uVar1 >> 0x10);
  auVar140._11_4_ = 0;
  auVar140._0_11_ = auVar112;
  auVar91[2] = (char)(uVar1 >> 8);
  auVar91._0_2_ = (ushort)uVar1;
  auVar91._3_12_ = SUB1512(auVar140 << 0x20,3);
  auVar178._0_2_ = (ushort)uVar1 & 0xff;
  auVar178._2_13_ = auVar91._2_13_;
  auVar178[0xf] = 0;
  auVar8._8_6_ = 0;
  auVar8._0_8_ = uVar2;
  auVar8[0xe] = (char)(uVar2 >> 0x38);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar2;
  auVar22[0xc] = (char)(uVar2 >> 0x30);
  auVar22._13_2_ = auVar8._13_2_;
  auVar36._8_4_ = 0;
  auVar36._0_8_ = uVar2;
  auVar36._12_3_ = auVar22._12_3_;
  auVar50._8_2_ = 0;
  auVar50._0_8_ = uVar2;
  auVar50[10] = (char)(uVar2 >> 0x28);
  auVar50._11_4_ = auVar36._11_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar2;
  auVar64._10_5_ = auVar50._10_5_;
  auVar78[8] = (char)(uVar2 >> 0x20);
  auVar78._0_8_ = uVar2;
  auVar78._9_6_ = auVar64._9_6_;
  auVar113._7_8_ = 0;
  auVar113._0_7_ = auVar78._8_7_;
  Var105 = CONCAT81(SUB158(auVar113 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar141._9_6_ = 0;
  auVar141._0_9_ = Var105;
  auVar114._1_10_ = SUB1510(auVar141 << 0x30,5);
  auVar114[0] = (char)(uVar2 >> 0x10);
  auVar142._11_4_ = 0;
  auVar142._0_11_ = auVar114;
  auVar92[2] = (char)(uVar2 >> 8);
  auVar92._0_2_ = (ushort)uVar2;
  auVar92._3_12_ = SUB1512(auVar142 << 0x20,3);
  auVar190._0_2_ = (ushort)uVar2 & 0xff;
  auVar190._2_13_ = auVar92._2_13_;
  auVar190[0xf] = 0;
  auVar203._0_2_ = auVar178._0_2_ * 3;
  auVar203._2_2_ = auVar91._2_2_ * 6;
  auVar203._4_2_ = auVar112._0_2_ * 9;
  auVar203._6_2_ = (short)Var102 * 0xc;
  auVar203._8_2_ = auVar77._8_2_ * 9;
  auVar203._10_2_ = auVar49._10_2_ * 6;
  auVar203._12_2_ = auVar21._12_2_ * 3;
  auVar203._14_2_ = 0;
  auVar194._0_2_ = auVar190._0_2_ * 3;
  auVar194._2_2_ = auVar92._2_2_ * 6;
  auVar194._4_2_ = auVar114._0_2_ * 9;
  auVar194._6_2_ = (short)Var105 * 0xc;
  auVar194._8_2_ = auVar78._8_2_ * 9;
  auVar194._10_2_ = auVar50._10_2_ * 6;
  auVar194._12_2_ = auVar22._12_2_ * 3;
  auVar194._14_2_ = 0;
  auVar204 = pmaddwd(auVar203,auVar178);
  auVar183 = pmaddwd(auVar178,auVar194);
  auVar195 = pmaddwd(auVar194,auVar190);
  uVar1 = *(ulong *)(src1 + lVar159 * 3);
  uVar2 = *(ulong *)(src2 + lVar160 * 3);
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xe] = (char)(uVar1 >> 0x38);
  auVar23._8_4_ = 0;
  auVar23._0_8_ = uVar1;
  auVar23[0xc] = (char)(uVar1 >> 0x30);
  auVar23._13_2_ = auVar9._13_2_;
  auVar37._8_4_ = 0;
  auVar37._0_8_ = uVar1;
  auVar37._12_3_ = auVar23._12_3_;
  auVar51._8_2_ = 0;
  auVar51._0_8_ = uVar1;
  auVar51[10] = (char)(uVar1 >> 0x28);
  auVar51._11_4_ = auVar37._11_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar1;
  auVar65._10_5_ = auVar51._10_5_;
  auVar79[8] = (char)(uVar1 >> 0x20);
  auVar79._0_8_ = uVar1;
  auVar79._9_6_ = auVar65._9_6_;
  auVar115._7_8_ = 0;
  auVar115._0_7_ = auVar79._8_7_;
  Var102 = CONCAT81(SUB158(auVar115 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar143._9_6_ = 0;
  auVar143._0_9_ = Var102;
  auVar116._1_10_ = SUB1510(auVar143 << 0x30,5);
  auVar116[0] = (char)(uVar1 >> 0x10);
  auVar144._11_4_ = 0;
  auVar144._0_11_ = auVar116;
  auVar93[2] = (char)(uVar1 >> 8);
  auVar93._0_2_ = (ushort)uVar1;
  auVar93._3_12_ = SUB1512(auVar144 << 0x20,3);
  auVar175._0_2_ = (ushort)uVar1 & 0xff;
  auVar175._2_13_ = auVar93._2_13_;
  auVar175[0xf] = 0;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar2;
  auVar10[0xe] = (char)(uVar2 >> 0x38);
  auVar24._8_4_ = 0;
  auVar24._0_8_ = uVar2;
  auVar24[0xc] = (char)(uVar2 >> 0x30);
  auVar24._13_2_ = auVar10._13_2_;
  auVar38._8_4_ = 0;
  auVar38._0_8_ = uVar2;
  auVar38._12_3_ = auVar24._12_3_;
  auVar52._8_2_ = 0;
  auVar52._0_8_ = uVar2;
  auVar52[10] = (char)(uVar2 >> 0x28);
  auVar52._11_4_ = auVar38._11_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar2;
  auVar66._10_5_ = auVar52._10_5_;
  auVar80[8] = (char)(uVar2 >> 0x20);
  auVar80._0_8_ = uVar2;
  auVar80._9_6_ = auVar66._9_6_;
  auVar117._7_8_ = 0;
  auVar117._0_7_ = auVar80._8_7_;
  Var105 = CONCAT81(SUB158(auVar117 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar145._9_6_ = 0;
  auVar145._0_9_ = Var105;
  auVar118._1_10_ = SUB1510(auVar145 << 0x30,5);
  auVar118[0] = (char)(uVar2 >> 0x10);
  auVar146._11_4_ = 0;
  auVar146._0_11_ = auVar118;
  auVar94[2] = (char)(uVar2 >> 8);
  auVar94._0_2_ = (ushort)uVar2;
  auVar94._3_12_ = SUB1512(auVar146 << 0x20,3);
  auVar197._0_2_ = (ushort)uVar2 & 0xff;
  auVar197._2_13_ = auVar94._2_13_;
  auVar197[0xf] = 0;
  auVar200._0_2_ = auVar175._0_2_ * 4;
  auVar200._2_2_ = auVar93._2_2_ * 8;
  auVar200._4_2_ = auVar116._0_2_ * 0xc;
  auVar200._6_2_ = (short)Var102 * 0x10;
  auVar200._8_2_ = auVar79._8_2_ * 0xc;
  auVar200._10_2_ = auVar51._10_2_ * 8;
  auVar200._12_2_ = auVar23._12_2_ * 4;
  auVar200._14_2_ = 0;
  auVar189._0_2_ = auVar197._0_2_ * 4;
  auVar189._2_2_ = auVar94._2_2_ * 8;
  auVar189._4_2_ = auVar118._0_2_ * 0xc;
  auVar189._6_2_ = (short)Var105 * 0x10;
  auVar189._8_2_ = auVar80._8_2_ * 0xc;
  auVar189._10_2_ = auVar52._10_2_ * 8;
  auVar189._12_2_ = auVar24._12_2_ * 4;
  auVar189._14_2_ = 0;
  auVar201 = pmaddwd(auVar200,auVar175);
  auVar178 = pmaddwd(auVar175,auVar189);
  auVar190 = pmaddwd(auVar189,auVar197);
  uVar1 = *(ulong *)(src1 + lVar159 * 4);
  uVar2 = *(ulong *)(src2 + lVar160 * 4);
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xe] = (char)(uVar1 >> 0x38);
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25[0xc] = (char)(uVar1 >> 0x30);
  auVar25._13_2_ = auVar11._13_2_;
  auVar39._8_4_ = 0;
  auVar39._0_8_ = uVar1;
  auVar39._12_3_ = auVar25._12_3_;
  auVar53._8_2_ = 0;
  auVar53._0_8_ = uVar1;
  auVar53[10] = (char)(uVar1 >> 0x28);
  auVar53._11_4_ = auVar39._11_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar1;
  auVar67._10_5_ = auVar53._10_5_;
  auVar81[8] = (char)(uVar1 >> 0x20);
  auVar81._0_8_ = uVar1;
  auVar81._9_6_ = auVar67._9_6_;
  auVar119._7_8_ = 0;
  auVar119._0_7_ = auVar81._8_7_;
  Var102 = CONCAT81(SUB158(auVar119 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar147._9_6_ = 0;
  auVar147._0_9_ = Var102;
  auVar120._1_10_ = SUB1510(auVar147 << 0x30,5);
  auVar120[0] = (char)(uVar1 >> 0x10);
  auVar148._11_4_ = 0;
  auVar148._0_11_ = auVar120;
  auVar95[2] = (char)(uVar1 >> 8);
  auVar95._0_2_ = (ushort)uVar1;
  auVar95._3_12_ = SUB1512(auVar148 << 0x20,3);
  auVar184._0_2_ = (ushort)uVar1 & 0xff;
  auVar184._2_13_ = auVar95._2_13_;
  auVar184[0xf] = 0;
  auVar12._8_6_ = 0;
  auVar12._0_8_ = uVar2;
  auVar12[0xe] = (char)(uVar2 >> 0x38);
  auVar26._8_4_ = 0;
  auVar26._0_8_ = uVar2;
  auVar26[0xc] = (char)(uVar2 >> 0x30);
  auVar26._13_2_ = auVar12._13_2_;
  auVar40._8_4_ = 0;
  auVar40._0_8_ = uVar2;
  auVar40._12_3_ = auVar26._12_3_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar2;
  auVar54[10] = (char)(uVar2 >> 0x28);
  auVar54._11_4_ = auVar40._11_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar2;
  auVar68._10_5_ = auVar54._10_5_;
  auVar82[8] = (char)(uVar2 >> 0x20);
  auVar82._0_8_ = uVar2;
  auVar82._9_6_ = auVar68._9_6_;
  auVar121._7_8_ = 0;
  auVar121._0_7_ = auVar82._8_7_;
  Var105 = CONCAT81(SUB158(auVar121 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar149._9_6_ = 0;
  auVar149._0_9_ = Var105;
  auVar122._1_10_ = SUB1510(auVar149 << 0x30,5);
  auVar122[0] = (char)(uVar2 >> 0x10);
  auVar150._11_4_ = 0;
  auVar150._0_11_ = auVar122;
  auVar96[2] = (char)(uVar2 >> 8);
  auVar96._0_2_ = (ushort)uVar2;
  auVar96._3_12_ = SUB1512(auVar150 << 0x20,3);
  auVar192._0_2_ = (ushort)uVar2 & 0xff;
  auVar192._2_13_ = auVar96._2_13_;
  auVar192[0xf] = 0;
  auVar196._0_2_ = auVar184._0_2_ * 3;
  auVar196._2_2_ = auVar95._2_2_ * 6;
  auVar196._4_2_ = auVar120._0_2_ * 9;
  auVar196._6_2_ = (short)Var102 * 0xc;
  auVar196._8_2_ = auVar81._8_2_ * 9;
  auVar196._10_2_ = auVar53._10_2_ * 6;
  auVar196._12_2_ = auVar25._12_2_ * 3;
  auVar196._14_2_ = 0;
  auVar174._0_2_ = auVar192._0_2_ * 3;
  auVar174._2_2_ = auVar96._2_2_ * 6;
  auVar174._4_2_ = auVar122._0_2_ * 9;
  auVar174._6_2_ = (short)Var105 * 0xc;
  auVar174._8_2_ = auVar82._8_2_ * 9;
  auVar174._10_2_ = auVar54._10_2_ * 6;
  auVar174._12_2_ = auVar26._12_2_ * 3;
  auVar174._14_2_ = 0;
  auVar197 = pmaddwd(auVar196,auVar184);
  auVar184 = pmaddwd(auVar184,auVar174);
  auVar175 = pmaddwd(auVar174,auVar192);
  uVar1 = *(ulong *)(src1 + lVar159 * 5);
  uVar2 = *(ulong *)(src2 + lVar160 * 5);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[0xe] = (char)(uVar1 >> 0x38);
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar1;
  auVar27[0xc] = (char)(uVar1 >> 0x30);
  auVar27._13_2_ = auVar13._13_2_;
  auVar41._8_4_ = 0;
  auVar41._0_8_ = uVar1;
  auVar41._12_3_ = auVar27._12_3_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55[10] = (char)(uVar1 >> 0x28);
  auVar55._11_4_ = auVar41._11_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar1;
  auVar69._10_5_ = auVar55._10_5_;
  auVar83[8] = (char)(uVar1 >> 0x20);
  auVar83._0_8_ = uVar1;
  auVar83._9_6_ = auVar69._9_6_;
  auVar123._7_8_ = 0;
  auVar123._0_7_ = auVar83._8_7_;
  Var102 = CONCAT81(SUB158(auVar123 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar151._9_6_ = 0;
  auVar151._0_9_ = Var102;
  auVar124._1_10_ = SUB1510(auVar151 << 0x30,5);
  auVar124[0] = (char)(uVar1 >> 0x10);
  auVar152._11_4_ = 0;
  auVar152._0_11_ = auVar124;
  auVar97[2] = (char)(uVar1 >> 8);
  auVar97._0_2_ = (ushort)uVar1;
  auVar97._3_12_ = SUB1512(auVar152 << 0x20,3);
  auVar179._0_2_ = (ushort)uVar1 & 0xff;
  auVar179._2_13_ = auVar97._2_13_;
  auVar179[0xf] = 0;
  auVar14._8_6_ = 0;
  auVar14._0_8_ = uVar2;
  auVar14[0xe] = (char)(uVar2 >> 0x38);
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar2;
  auVar28[0xc] = (char)(uVar2 >> 0x30);
  auVar28._13_2_ = auVar14._13_2_;
  auVar42._8_4_ = 0;
  auVar42._0_8_ = uVar2;
  auVar42._12_3_ = auVar28._12_3_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar2;
  auVar56[10] = (char)(uVar2 >> 0x28);
  auVar56._11_4_ = auVar42._11_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar2;
  auVar70._10_5_ = auVar56._10_5_;
  auVar84[8] = (char)(uVar2 >> 0x20);
  auVar84._0_8_ = uVar2;
  auVar84._9_6_ = auVar70._9_6_;
  auVar125._7_8_ = 0;
  auVar125._0_7_ = auVar84._8_7_;
  Var105 = CONCAT81(SUB158(auVar125 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar153._9_6_ = 0;
  auVar153._0_9_ = Var105;
  auVar126._1_10_ = SUB1510(auVar153 << 0x30,5);
  auVar126[0] = (char)(uVar2 >> 0x10);
  auVar154._11_4_ = 0;
  auVar154._0_11_ = auVar126;
  auVar98[2] = (char)(uVar2 >> 8);
  auVar98._0_2_ = (ushort)uVar2;
  auVar98._3_12_ = SUB1512(auVar154 << 0x20,3);
  auVar202._0_2_ = (ushort)uVar2 & 0xff;
  auVar202._2_13_ = auVar98._2_13_;
  auVar202[0xf] = 0;
  auVar191._0_2_ = auVar179._0_2_ * 2;
  auVar191._2_2_ = auVar97._2_2_ * 4;
  auVar191._4_2_ = auVar124._0_2_ * 6;
  auVar191._6_2_ = (short)Var102 * 8;
  auVar191._8_2_ = auVar83._8_2_ * 6;
  auVar191._10_2_ = auVar55._10_2_ * 4;
  auVar191._12_2_ = auVar27._12_2_ * 2;
  auVar191._14_2_ = 0;
  auVar169._0_2_ = auVar202._0_2_ * 2;
  auVar169._2_2_ = auVar98._2_2_ * 4;
  auVar169._4_2_ = auVar126._0_2_ * 6;
  auVar169._6_2_ = (short)Var105 * 8;
  auVar169._8_2_ = auVar84._8_2_ * 6;
  auVar169._10_2_ = auVar56._10_2_ * 4;
  auVar169._12_2_ = auVar28._12_2_ * 2;
  auVar169._14_2_ = 0;
  auVar192 = pmaddwd(auVar191,auVar179);
  auVar179 = pmaddwd(auVar179,auVar169);
  auVar170 = pmaddwd(auVar169,auVar202);
  uVar1 = *(ulong *)(src1 + lVar159 * 6);
  uVar2 = *(ulong *)(src2 + lVar160 * 6);
  auVar15._8_6_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[0xe] = (char)(uVar1 >> 0x38);
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar1;
  auVar29[0xc] = (char)(uVar1 >> 0x30);
  auVar29._13_2_ = auVar15._13_2_;
  auVar43._8_4_ = 0;
  auVar43._0_8_ = uVar1;
  auVar43._12_3_ = auVar29._12_3_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar1;
  auVar57[10] = (char)(uVar1 >> 0x28);
  auVar57._11_4_ = auVar43._11_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar1;
  auVar71._10_5_ = auVar57._10_5_;
  auVar85[8] = (char)(uVar1 >> 0x20);
  auVar85._0_8_ = uVar1;
  auVar85._9_6_ = auVar71._9_6_;
  auVar127._7_8_ = 0;
  auVar127._0_7_ = auVar85._8_7_;
  Var102 = CONCAT81(SUB158(auVar127 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar155._9_6_ = 0;
  auVar155._0_9_ = Var102;
  auVar128._1_10_ = SUB1510(auVar155 << 0x30,5);
  auVar128[0] = (char)(uVar1 >> 0x10);
  auVar156._11_4_ = 0;
  auVar156._0_11_ = auVar128;
  uVar180 = (ushort)uVar1;
  auVar99[2] = (char)(uVar1 >> 8);
  auVar99._0_2_ = uVar180;
  auVar99._3_12_ = SUB1512(auVar156 << 0x20,3);
  auVar185._0_2_ = uVar180 & 0xff;
  auVar185._2_13_ = auVar99._2_13_;
  auVar185[0xf] = 0;
  auVar16._8_6_ = 0;
  auVar16._0_8_ = uVar2;
  auVar16[0xe] = (char)(uVar2 >> 0x38);
  auVar30._8_4_ = 0;
  auVar30._0_8_ = uVar2;
  auVar30[0xc] = (char)(uVar2 >> 0x30);
  auVar30._13_2_ = auVar16._13_2_;
  auVar44._8_4_ = 0;
  auVar44._0_8_ = uVar2;
  auVar44._12_3_ = auVar30._12_3_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar2;
  auVar58[10] = (char)(uVar2 >> 0x28);
  auVar58._11_4_ = auVar44._11_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar2;
  auVar72._10_5_ = auVar58._10_5_;
  auVar86[8] = (char)(uVar2 >> 0x20);
  auVar86._0_8_ = uVar2;
  auVar86._9_6_ = auVar72._9_6_;
  auVar129._7_8_ = 0;
  auVar129._0_7_ = auVar86._8_7_;
  Var105 = CONCAT81(SUB158(auVar129 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar157._9_6_ = 0;
  auVar157._0_9_ = Var105;
  auVar130._1_10_ = SUB1510(auVar157 << 0x30,5);
  auVar130[0] = (char)(uVar2 >> 0x10);
  auVar158._11_4_ = 0;
  auVar158._0_11_ = auVar130;
  uVar171 = (ushort)uVar2;
  auVar100[2] = (char)(uVar2 >> 8);
  auVar100._0_2_ = uVar171;
  auVar100._3_12_ = SUB1512(auVar158 << 0x20,3);
  auVar176._0_2_ = uVar171 & 0xff;
  auVar176._2_13_ = auVar100._2_13_;
  auVar176[0xf] = 0;
  sStack_36 = auVar99._2_2_ * 2;
  sStack_34 = auVar128._0_2_ * 3;
  sStack_32 = (short)Var102 * 4;
  auVar206._0_8_ =
       CONCAT26(sStack_32,CONCAT24(sStack_34,CONCAT22(sStack_36,uVar180))) & 0xffffffffffff00ff;
  auVar206._8_2_ = auVar85._8_2_ * 3;
  auVar206._10_2_ = auVar57._10_2_ * 2;
  auVar206._12_2_ = auVar29._12_2_;
  auVar206._14_2_ = 0;
  sStack_46 = auVar100._2_2_ * 2;
  sStack_44 = auVar130._0_2_ * 3;
  sStack_42 = (short)Var105 * 4;
  auVar205._0_8_ =
       CONCAT26(sStack_42,CONCAT24(sStack_44,CONCAT22(sStack_46,uVar171))) & 0xffffffffffff00ff;
  auVar205._8_2_ = auVar86._8_2_ * 3;
  auVar205._10_2_ = auVar58._10_2_ * 2;
  auVar205._12_2_ = auVar30._12_2_;
  auVar205._14_2_ = 0;
  local_38 = auVar181._0_2_ + auVar198._0_2_ + auVar203._0_2_ + auVar200._0_2_ + auVar196._0_2_ +
             auVar191._0_2_ + auVar185._0_2_;
  sStack_36 = sVar165 + auVar198._2_2_ + auVar203._2_2_ + auVar200._2_2_ + auVar196._2_2_ +
              auVar191._2_2_ + sStack_36;
  sStack_34 = sVar166 + auVar198._4_2_ + auVar203._4_2_ + auVar200._4_2_ + auVar196._4_2_ +
              auVar191._4_2_ + sStack_34;
  sStack_32 = sVar167 + auVar198._6_2_ + auVar203._6_2_ + auVar200._6_2_ + auVar196._6_2_ +
              auVar191._6_2_ + sStack_32;
  sStack_30 = auVar186._8_2_ + auVar198._8_2_ + auVar203._8_2_ + auVar200._8_2_ + auVar196._8_2_ +
              auVar191._8_2_ + auVar206._8_2_;
  sStack_2e = auVar186._10_2_ + auVar198._10_2_ + auVar203._10_2_ + auVar200._10_2_ +
              auVar196._10_2_ + auVar191._10_2_ + auVar206._10_2_;
  sStack_2c = auVar186._12_2_ + auVar198._12_2_ + auVar203._12_2_ + auVar200._12_2_ +
              auVar196._12_2_ + auVar191._12_2_ + auVar206._12_2_;
  uStack_2a = 0;
  local_48 = auVar172._0_2_ + auVar187._0_2_ + auVar194._0_2_ + auVar189._0_2_ + auVar174._0_2_ +
             auVar169._0_2_ + auVar176._0_2_;
  sStack_46 = sVar162 + auVar187._2_2_ + auVar194._2_2_ + auVar189._2_2_ + auVar174._2_2_ +
              auVar169._2_2_ + sStack_46;
  sStack_44 = sVar163 + auVar187._4_2_ + auVar194._4_2_ + auVar189._4_2_ + auVar174._4_2_ +
              auVar169._4_2_ + sStack_44;
  sStack_42 = sVar164 + auVar187._6_2_ + auVar194._6_2_ + auVar189._6_2_ + auVar174._6_2_ +
              auVar169._6_2_ + sStack_42;
  sStack_40 = auVar168._8_2_ + auVar187._8_2_ + auVar194._8_2_ + auVar189._8_2_ + auVar174._8_2_ +
              auVar169._8_2_ + auVar205._8_2_;
  sStack_3e = auVar168._10_2_ + auVar187._10_2_ + auVar194._10_2_ + auVar189._10_2_ +
              auVar174._10_2_ + auVar169._10_2_ + auVar205._10_2_;
  sStack_3c = auVar168._12_2_ + auVar187._12_2_ + auVar194._12_2_ + auVar189._12_2_ +
              auVar174._12_2_ + auVar169._12_2_ + auVar30._12_2_;
  uStack_3a = 0;
  auVar168 = pmaddwd(auVar206,auVar185);
  auVar186 = pmaddwd(auVar185,auVar205);
  auVar206 = pmaddwd(auVar205,auVar176);
  local_28.xm = HorizontalAdd16b_SSE2((__m128i *)&local_38);
  local_28.ym = HorizontalAdd16b_SSE2((__m128i *)&local_48);
  local_28.xxm = auVar168._8_4_ +
                 auVar192._8_4_ +
                 auVar197._8_4_ + auVar201._8_4_ + auVar204._8_4_ + auVar199._8_4_ + auVar193._8_4_
                 + auVar168._0_4_ +
                   auVar192._0_4_ +
                   auVar197._0_4_ +
                   auVar201._0_4_ + auVar204._0_4_ + auVar199._0_4_ + auVar193._0_4_ +
                 auVar168._12_4_ +
                 auVar192._12_4_ +
                 auVar197._12_4_ +
                 auVar201._12_4_ + auVar204._12_4_ + auVar199._12_4_ + auVar193._12_4_ +
                 auVar168._4_4_ +
                 auVar192._4_4_ +
                 auVar197._4_4_ + auVar201._4_4_ + auVar204._4_4_ + auVar199._4_4_ + auVar193._4_4_;
  local_28.xym = auVar186._8_4_ +
                 auVar179._8_4_ +
                 auVar184._8_4_ + auVar178._8_4_ + auVar183._8_4_ + auVar177._8_4_ + auVar182._8_4_
                 + auVar186._0_4_ +
                   auVar179._0_4_ +
                   auVar184._0_4_ +
                   auVar178._0_4_ + auVar183._0_4_ + auVar177._0_4_ + auVar182._0_4_ +
                 auVar186._12_4_ +
                 auVar179._12_4_ +
                 auVar184._12_4_ +
                 auVar178._12_4_ + auVar183._12_4_ + auVar177._12_4_ + auVar182._12_4_ +
                 auVar186._4_4_ +
                 auVar179._4_4_ +
                 auVar184._4_4_ + auVar178._4_4_ + auVar183._4_4_ + auVar177._4_4_ + auVar182._4_4_;
  local_28.yym = auVar206._12_4_ +
                 auVar170._12_4_ +
                 auVar175._12_4_ +
                 auVar190._12_4_ + auVar195._12_4_ + auVar188._12_4_ + auVar173._12_4_ +
                 auVar206._4_4_ +
                 auVar170._4_4_ +
                 auVar175._4_4_ + auVar190._4_4_ + auVar195._4_4_ + auVar188._4_4_ + auVar173._4_4_
                 + auVar206._8_4_ +
                   auVar170._8_4_ +
                   auVar175._8_4_ +
                   auVar190._8_4_ + auVar195._8_4_ + auVar188._8_4_ + auVar173._8_4_ +
                   auVar206._0_4_ +
                   auVar170._0_4_ +
                   auVar175._0_4_ +
                   auVar190._0_4_ + auVar195._0_4_ + auVar188._0_4_ + auVar173._0_4_;
  dVar161 = VP8SSIMFromStats(&local_28);
  return dVar161;
}

Assistant:

double SSIMGet_SSE2(const uint8_t* src1, int stride1,
                           const uint8_t* src2, int stride2) {
  VP8DistoStats stats;
  const __m128i zero = _mm_setzero_si128();
  __m128i xm = zero, ym = zero;                // 16b accums
  __m128i xxm = zero, yym = zero, xym = zero;  // 32b accum
  const __m128i Wx = _mm_loadu_si128((const __m128i*)kWeight);
  assert(2 * VP8_SSIM_KERNEL + 1 == 7);
  ACCUMULATE_ROW(1);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(4);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(1);
  stats.xm  = HorizontalAdd16b_SSE2(&xm);
  stats.ym  = HorizontalAdd16b_SSE2(&ym);
  stats.xxm = HorizontalAdd32b_SSE2(&xxm);
  stats.xym = HorizontalAdd32b_SSE2(&xym);
  stats.yym = HorizontalAdd32b_SSE2(&yym);
  return VP8SSIMFromStats(&stats);
}